

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O1

void draw(int which,int x,int y,int w,int h,int inset)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  code *pcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined8 uVar14;
  double local_58;
  ulong uVar2;
  ulong uVar6;
  
  if (w <= inset * 2) {
    inset = (w - (w + -1 >> 0x1f)) + -1 >> 1;
  }
  if (h <= inset * 2) {
    inset = (h - (h + -1 >> 0x1f)) + -1 >> 1;
  }
  uVar3 = w + inset * -2;
  uVar12 = h + inset * -2;
  uVar11 = uVar3;
  if (h < w) {
    uVar11 = uVar12;
  }
  if ((int)uVar11 < 2) {
    return;
  }
  uVar5 = x + inset;
  uVar6 = (ulong)uVar5;
  uVar1 = y + inset;
  uVar2 = (ulong)uVar1;
  pcVar10 = fl_arc_i;
  if (which == 3) {
    pcVar10 = fl_pie;
  }
  if (which < 2) {
    if (which == 0) {
      iVar13 = 0xb4;
      if (h < w) {
        iVar13 = 0x5a;
      }
      (*pcVar10)(0x4046800000000000,(uVar3 + uVar5) - uVar11,uVar2,uVar11,uVar11);
      uVar8 = (ulong)((uVar12 + uVar1) - uVar11);
      uVar14 = 0x406c200000000000;
      uVar9 = uVar6;
    }
    else {
      iVar13 = 0x168;
      if (h < w) {
        iVar13 = 0x10e;
      }
      (*pcVar10)(0x406c200000000000,uVar6,(uVar12 + uVar1) - uVar11,uVar11,uVar11);
      uVar14 = 0x4079500000000000;
      uVar8 = uVar2;
      uVar9 = (ulong)((uVar3 + uVar5) - uVar11);
    }
    local_58 = (double)iVar13;
    (*pcVar10)(local_58,uVar14,uVar9,uVar8,uVar11,uVar11);
  }
  else {
    iVar13 = -0x5a;
    if (w <= h) {
      iVar13 = 0;
    }
    iVar4 = 0xb4;
    if (h < w) {
      iVar4 = 0x5a;
    }
    iVar7 = 0x168;
    if (h < w) {
      iVar7 = 0x10e;
    }
    (*pcVar10)((double)iVar13,(uVar3 + uVar5) - uVar11,uVar2,uVar11,uVar11);
    (*pcVar10)((double)iVar4,(double)iVar7,uVar6,(uVar12 + uVar1) - uVar11,uVar11,uVar11);
  }
  if (which != 3) {
    if (w < h) {
      if ((which != 0) &&
         ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)((uVar3 + uVar5) - 1),
                     (ulong)((uVar1 + (uVar11 >> 1)) - 1),
                     (ulong)(((uVar1 + uVar12) - (uVar11 >> 1)) + 1)), which == 1)) {
        return;
      }
      uVar2 = (ulong)((uVar1 + (uVar11 >> 1)) - 1);
      iVar13 = (uVar12 + uVar1) - (uVar11 >> 1);
      UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
    }
    else {
      if (w <= h) {
        return;
      }
      if ((which != 0) &&
         ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)((uVar5 + (uVar11 >> 1)) - 1),
                     (ulong)((uVar1 + uVar12) - 1),(ulong)(((uVar3 + uVar5) - (uVar11 >> 1)) + 1)),
         which == 1)) {
        return;
      }
      uVar6 = (ulong)((uVar5 + (uVar11 >> 1)) - 1);
      iVar13 = (uVar3 + uVar5) - (uVar11 >> 1);
      UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
    }
    (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,uVar6,uVar2,(ulong)(iVar13 + 1));
    return;
  }
  if (w < h) {
    uVar2 = (ulong)((uVar11 >> 1) + uVar1);
    uVar12 = uVar12 - (uVar11 & 0x7ffffffe);
    UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
  }
  else {
    if (w <= h) {
      return;
    }
    uVar6 = (ulong)((uVar11 >> 1) + uVar5);
    uVar3 = uVar3 - (uVar11 & 0x7ffffffe);
    UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
  }
  (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,uVar6,uVar2,(ulong)uVar3,uVar12);
  return;
}

Assistant:

static void draw(int which, int x,int y,int w,int h, int inset)
{
  if (inset*2 >= w) inset = (w-1)/2;
  if (inset*2 >= h) inset = (h-1)/2;
  x += inset;
  y += inset;
  w -= 2*inset;
  h -= 2*inset;
  int d = w <= h ? w : h;
  if (d <= 1) return;
  void (*f)(int,int,int,int,double,double);
  f = (which==FILL) ? fl_pie : fl_arc_i;
  if (which >= CLOSED) {
    f(x+w-d, y, d, d, w<=h ? 0 : -90, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, w<=h ? 360 : 270);
  } else if (which == UPPER_LEFT) {
    f(x+w-d, y, d, d, 45, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, 225);
  } else { // LOWER_RIGHT
    f(x, y+h-d, d, d, 225, w<=h ? 360 : 270);
    f(x+w-d, y, d, d, w<=h ? 360 : 270, 360+45);
  }
  if (which == FILL) {
    if (w < h)
      fl_rectf(x, y+d/2, w, h-(d&-2));
    else if (w > h)
      fl_rectf(x+d/2, y, w-(d&-2), h);
  } else {
    if (w < h) {
      if (which != UPPER_LEFT) fl_yxline(x+w-1, y+d/2-1, y+h-d/2+1);
      if (which != LOWER_RIGHT) fl_yxline(x, y+d/2-1, y+h-d/2+1);
    } else if (w > h) {
      if (which != UPPER_LEFT) fl_xyline(x+d/2-1, y+h-1, x+w-d/2+1);
      if (which != LOWER_RIGHT) fl_xyline(x+d/2-1, y, x+w-d/2+1);
    }
  }
}